

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
::swap(dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
       *this,dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
             *ht)

{
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *in_RSI;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  Settings *in_stack_00000008;
  Settings *in_stack_00000010;
  size_type in_stack_ffffffffffffffd8;
  
  std::
  swap<google::dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>::Settings>
            (in_stack_00000010,in_stack_00000008);
  std::
  swap<google::dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>::KeyInfo>
            (&in_RDI->key_info,&in_RSI->key_info);
  std::swap<unsigned_long>(&in_RDI->num_deleted,&in_RSI->num_deleted);
  std::swap<unsigned_long>(&in_RDI->num_elements,&in_RSI->num_elements);
  std::swap<unsigned_long>(&in_RDI->num_buckets,&in_RSI->num_buckets);
  std::swap<char_const**>(&in_RDI->table,&in_RSI->table);
  bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)in_RDI,
                   in_stack_ffffffffffffffd8);
  bucket_count(in_RSI);
  sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)in_RDI,
                   in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void swap(dense_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    std::swap(num_elements, ht.num_elements);
    std::swap(num_buckets, ht.num_buckets);
    std::swap(table, ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }